

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TimeScaleDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimeScaleDirectiveSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3)

{
  Token slash;
  Token timePrecision;
  TimeScaleDirectiveSyntax *this_00;
  Token *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  Token *in_R8;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  this_00 = (TimeScaleDirectiveSyntax *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  slash.info = (Info *)*in_RSI;
  slash._0_8_ = *(undefined8 *)(in_RDX + 8);
  timePrecision.info = (Info *)in_R8;
  timePrecision._0_8_ = in_RSI[1];
  slang::syntax::TimeScaleDirectiveSyntax::TimeScaleDirectiveSyntax
            (this_00,*in_RCX,*in_R8,slash,timePrecision);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }